

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O0

void ggml_compute_forward_add1_bf16_bf16(ggml_compute_params *params,ggml_tensor *dst)

{
  int *piVar1;
  int *piVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  ggml_bf16_t gVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  int *in_RSI;
  int *in_RDI;
  float fVar19;
  float fVar20;
  int i;
  ggml_bf16_t *src0_ptr;
  ggml_bf16_t *dst_ptr;
  int i1;
  int i2;
  int i3;
  int ir;
  int ir1;
  int ir0;
  int dr;
  size_t nb3;
  size_t nb2;
  size_t nb1;
  size_t nb0;
  int64_t ne3;
  int64_t ne2;
  int64_t ne1;
  int64_t ne0;
  size_t nb03;
  size_t nb02;
  size_t nb01;
  size_t nb00;
  int64_t ne03;
  int64_t ne02;
  int64_t ne01;
  int64_t ne00;
  int nr;
  int nth;
  int ith;
  float v;
  ggml_tensor *src1;
  ggml_tensor *src0;
  int local_f4;
  int local_ec;
  int local_c8;
  
  piVar1 = *(int **)(in_RSI + 0x26);
  piVar2 = *(int **)(in_RSI + 0x28);
  uVar18 = ggml_are_same_shape(piVar1,in_RSI);
  if ((uVar18 & 1) == 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x648,"GGML_ASSERT(%s) failed","ggml_are_same_shape(src0, dst)");
  }
  uVar18 = ggml_is_scalar(piVar2);
  if ((uVar18 & 1) == 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x649,"GGML_ASSERT(%s) failed","ggml_is_scalar(src1)");
  }
  fVar19 = ggml_compute_bf16_to_fp32((ggml_bf16_t)**(uint16_t **)(piVar2 + 0x3e));
  local_c8 = *in_RDI;
  iVar15 = in_RDI[1];
  local_f4 = ggml_nrows(piVar1);
  lVar3 = *(long *)(piVar1 + 0xc);
  lVar4 = *(long *)(piVar1 + 0xe);
  lVar5 = *(long *)(piVar1 + 0x10);
  lVar6 = *(long *)(piVar1 + 0x12);
  lVar7 = *(long *)(in_RSI + 4);
  lVar8 = *(long *)(in_RSI + 6);
  lVar9 = *(long *)(in_RSI + 8);
  lVar10 = *(long *)(in_RSI + 0xc);
  lVar11 = *(long *)(in_RSI + 0xe);
  lVar12 = *(long *)(in_RSI + 0x10);
  lVar13 = *(long *)(in_RSI + 0x12);
  if (*piVar1 != 0x1e) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x655,"GGML_ASSERT(%s) failed","src0->type == GGML_TYPE_BF16");
  }
  if (*piVar2 != 0x1e) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x656,"GGML_ASSERT(%s) failed","src1->type == GGML_TYPE_BF16");
  }
  if (*in_RSI != 0x1e) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x657,"GGML_ASSERT(%s) failed","dst->type == GGML_TYPE_BF16");
  }
  if (lVar10 != 2) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x659,"GGML_ASSERT(%s) failed","nb0 == sizeof(ggml_bf16_t)");
  }
  if (lVar3 != 2) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x65a,"GGML_ASSERT(%s) failed","nb00 == sizeof(ggml_bf16_t)");
  }
  iVar15 = (local_f4 + iVar15 + -1) / iVar15;
  local_c8 = iVar15 * local_c8;
  if (local_c8 + iVar15 < local_f4) {
    local_f4 = local_c8 + iVar15;
  }
  for (; local_c8 < local_f4; local_c8 = local_c8 + 1) {
    iVar15 = (int)((long)local_c8 / (lVar9 * lVar8));
    iVar16 = (int)(((long)local_c8 - iVar15 * lVar9 * lVar8) / lVar8);
    iVar17 = (local_c8 - iVar15 * (int)lVar9 * (int)lVar8) - iVar16 * (int)lVar8;
    lVar3 = *(long *)(in_RSI + 0x3e);
    lVar10 = *(long *)(piVar1 + 0x3e);
    for (local_ec = 0; local_ec < lVar7; local_ec = local_ec + 1) {
      fVar20 = ggml_compute_bf16_to_fp32
                         ((ggml_bf16_t)
                          *(uint16_t *)
                           (lVar10 + iVar15 * lVar6 + iVar16 * lVar5 + iVar17 * lVar4 +
                           (long)local_ec * 2));
      gVar14 = ggml_compute_fp32_to_bf16(fVar20 + fVar19);
      *(uint16_t *)
       (lVar3 + iVar15 * lVar13 + iVar16 * lVar12 + iVar17 * lVar11 + (long)local_ec * 2) =
           gVar14.bits;
    }
  }
  return;
}

Assistant:

static void ggml_compute_forward_add1_bf16_bf16(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];
    const ggml_tensor * src1 = dst->src[1];

    GGML_ASSERT(ggml_are_same_shape(src0, dst));
    GGML_ASSERT(ggml_is_scalar(src1));

    // scalar to add
    const float v = GGML_BF16_TO_FP32(*(ggml_bf16_t *) src1->data);

    const int ith = params->ith;
    const int nth = params->nth;

    const int nr  = ggml_nrows(src0);

    GGML_TENSOR_UNARY_OP_LOCALS

    GGML_ASSERT(src0->type == GGML_TYPE_BF16);
    GGML_ASSERT(src1->type == GGML_TYPE_BF16);
    GGML_ASSERT(dst->type  == GGML_TYPE_BF16);

    GGML_ASSERT( nb0 == sizeof(ggml_bf16_t));
    GGML_ASSERT(nb00 == sizeof(ggml_bf16_t));

    // rows per thread
    const int dr = (nr + nth - 1)/nth;

    // row range for this thread
    const int ir0 = dr*ith;
    const int ir1 = MIN(ir0 + dr, nr);

    for (int ir = ir0; ir < ir1; ++ir) {
        // src0 and dst are same shape => same indices
        const int i3 = ir/(ne2*ne1);
        const int i2 = (ir - i3*ne2*ne1)/ne1;
        const int i1 = (ir - i3*ne2*ne1 - i2*ne1);

        ggml_bf16_t * dst_ptr  = (ggml_bf16_t *) ((char *) dst->data  + i3*nb3  + i2*nb2  + i1*nb1 );
        ggml_bf16_t * src0_ptr = (ggml_bf16_t *) ((char *) src0->data + i3*nb03 + i2*nb02 + i1*nb01);
        for (int i = 0; i < ne0; i++) {
            dst_ptr[i] = GGML_FP32_TO_BF16(GGML_BF16_TO_FP32(src0_ptr[i]) + v);
        }
    }
}